

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

bool __thiscall
JsUtil::
BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::TryGetValue<int>(BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   *this,int *key,EquivalentPropertyEntry **value)

{
  int iVar1;
  EquivalentPropertyEntry **ppEVar2;
  int i;
  EquivalentPropertyEntry **value_local;
  int *key_local;
  BaseDictionary<int,_Js::EquivalentPropertyEntry_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  iVar1 = FindEntryWithKey<int>(this,key);
  if (-1 < iVar1) {
    ppEVar2 = anon_unknown_5::
              ValueEntry<Js::EquivalentPropertyEntry_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Js::EquivalentPropertyEntry_*>_>
              ::Value((ValueEntry<Js::EquivalentPropertyEntry_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Js::EquivalentPropertyEntry_*>_>
                       *)(this->entries + iVar1));
    *value = *ppEVar2;
  }
  return -1 < iVar1;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }